

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8_x509.cc
# Opt level: O1

int add_cert_bag(CBB *cbb,X509 *cert,char *name,uint8_t *key_id,size_t key_id_len)

{
  int iVar1;
  uint uVar2;
  uchar *name_00;
  size_t name_len;
  uint uVar3;
  uint8_t *buf;
  int int_name_len;
  CBB bag;
  CBB cert_bag;
  CBB cert_value;
  CBB wrapped_cert;
  CBB bag_contents;
  uint8_t *local_130;
  int local_124;
  CBB local_120;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  iVar1 = CBB_add_asn1(cbb,&local_120,0x20000010);
  uVar3 = 0;
  uVar2 = 0;
  if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1_element(&local_120,6,kCertBag,0xb), iVar1 != 0)) &&
       (iVar1 = CBB_add_asn1(&local_120,&local_60,0xa0000000), iVar1 != 0)) &&
      ((iVar1 = CBB_add_asn1(&local_60,&local_f0,0x20000010), uVar3 = uVar2, iVar1 != 0 &&
       (iVar1 = CBB_add_asn1_element(&local_f0,6,kX509Certificate,10), iVar1 != 0)))) &&
     ((iVar1 = CBB_add_asn1(&local_f0,&local_90,0xa0000000), iVar1 != 0 &&
      (iVar1 = CBB_add_asn1(&local_90,&local_c0,4), iVar1 != 0)))) {
    uVar2 = i2d_X509(cert,(uint8_t **)0x0);
    local_124 = 0;
    name_00 = X509_alias_get0((X509 *)cert,&local_124);
    name_len = (size_t)local_124;
    if (name != (char *)0x0) {
      if (local_124 != 0) {
        ERR_put_error(0x13,0,0x85,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8_x509.cc"
                      ,0x3ca);
        return 0;
      }
      name_len = strlen(name);
      name_00 = (uchar *)name;
    }
    uVar3 = 0;
    if (((-1 < (int)uVar2) && (iVar1 = CBB_add_space(&local_c0,&local_130,(ulong)uVar2), iVar1 != 0)
        ) && ((iVar1 = i2d_X509(cert,&local_130), -1 < iVar1 &&
              (iVar1 = add_bag_attributes(&local_120,(char *)name_00,name_len,key_id,key_id_len),
              iVar1 != 0)))) {
      iVar1 = CBB_flush(cbb);
      uVar3 = (uint)(iVar1 != 0);
    }
  }
  return uVar3;
}

Assistant:

static int add_cert_bag(CBB *cbb, X509 *cert, const char *name,
                        const uint8_t *key_id, size_t key_id_len) {
  CBB bag, bag_contents, cert_bag, wrapped_cert, cert_value;
  if (  // See https://tools.ietf.org/html/rfc7292#section-4.2.
      !CBB_add_asn1(cbb, &bag, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&bag, CBS_ASN1_OBJECT, kCertBag,
                            sizeof(kCertBag)) ||
      !CBB_add_asn1(&bag, &bag_contents,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      // See https://tools.ietf.org/html/rfc7292#section-4.2.3.
      !CBB_add_asn1(&bag_contents, &cert_bag, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&cert_bag, CBS_ASN1_OBJECT, kX509Certificate,
                            sizeof(kX509Certificate)) ||
      !CBB_add_asn1(&cert_bag, &wrapped_cert,
                    CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 0) ||
      !CBB_add_asn1(&wrapped_cert, &cert_value, CBS_ASN1_OCTETSTRING)) {
    return 0;
  }
  uint8_t *buf;
  int len = i2d_X509(cert, NULL);

  int int_name_len = 0;
  const char *cert_name = (const char *)X509_alias_get0(cert, &int_name_len);
  size_t name_len = int_name_len;
  if (name) {
    if (name_len != 0) {
      OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_AMBIGUOUS_FRIENDLY_NAME);
      return 0;
    }
    name_len = strlen(name);
  } else {
    name = cert_name;
  }

  if (len < 0 || !CBB_add_space(&cert_value, &buf, (size_t)len) ||
      i2d_X509(cert, &buf) < 0 ||
      !add_bag_attributes(&bag, name, name_len, key_id, key_id_len) ||
      !CBB_flush(cbb)) {
    return 0;
  }
  return 1;
}